

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O2

bool __thiscall irr::gui::CGUIEditBox::processKey(CGUIEditBox *this,SEvent *event)

{
  undefined1 *puVar1;
  size_type *psVar2;
  byte bVar3;
  u32 uVar4;
  pointer piVar5;
  EGUI_EVENT_TYPE type;
  char cVar6;
  bool bVar7;
  int iVar8;
  u32 uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  long lVar13;
  pointer psVar14;
  uint end;
  u32 uVar15;
  wchar_t c;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint begin;
  uint uVar19;
  stringw s;
  stringw s_1;
  string<wchar_t> local_50;
  
  bVar3 = (event->field_1).field13[0xc];
  if ((bVar3 & 1) == 0) {
    return false;
  }
  begin = this->MarkBegin;
  end = this->MarkEnd;
  c = (event->field_1).KeyInput.Char;
  if ((bVar3 & 4) != 0) {
    if (c == L'\\') {
      c = L'\\';
      goto switchD_00228eae_caseD_a;
    }
    iVar8 = (event->field_1).MouseInput.Y;
    if (iVar8 == 0x23) {
      if ((bVar3 & 2) == 0) {
        this->CursorPos = *(s32 *)&this->field_0xb0;
LAB_0022935f:
        end = 0;
        goto LAB_0022950e;
      }
      begin = this->CursorPos;
      this->CursorPos = 0;
      end = *(uint *)&this->field_0xb0;
    }
    else if (iVar8 == 0x24) {
      if ((bVar3 & 2) == 0) {
        this->CursorPos = 0;
        goto LAB_0022935f;
      }
      end = this->CursorPos;
      this->CursorPos = 0;
LAB_0022950e:
      begin = 0;
    }
    else if (iVar8 == 0x58) {
      if ((this->PasswordBox == false) && (begin != end && this->Operator != (IOSOperator *)0x0)) {
        uVar9 = end;
        if ((int)begin < (int)end) {
          uVar9 = begin;
        }
        uVar19 = end;
        if ((int)end < (int)begin) {
          uVar19 = begin;
        }
        s.str._M_dataplus._M_p = (pointer)&s.str.field_2;
        s.str._M_string_length = 0;
        s.str.field_2._M_local_buf[0] = (uint)(uint3)s.str.field_2._M_allocated_capacity._1_3_ << 8;
        puVar1 = &this->field_0xa8;
        lVar16 = (long)(int)begin - (long)(int)end;
        lVar13 = -lVar16;
        if (0 < lVar16) {
          lVar13 = lVar16;
        }
        core::string<wchar_t>::subString(&s_1,(string<wchar_t> *)puVar1,uVar9,(s32)lVar13,false);
        core::wStringToUTF8((stringc *)&s,s_1.str._M_dataplus._M_p);
        ::std::__cxx11::wstring::_M_dispose();
        (*this->Operator->_vptr_IOSOperator[1])(this->Operator,s.str._M_dataplus._M_p);
        cVar6 = (**(code **)(*(long *)this + 0x90))(this);
        if (cVar6 == '\0') goto LAB_002296bb;
        s_1.str._M_dataplus._M_p = (pointer)&s_1.str.field_2;
        s_1.str._M_string_length = 0;
        s_1.str.field_2._M_local_buf[0] = L'\0';
        core::string<wchar_t>::subString(&local_50,(string<wchar_t> *)puVar1,0,uVar9,false);
        core::string<wchar_t>::operator=((string<wchar_t> *)&s_1,&local_50);
        ::std::__cxx11::wstring::_M_dispose();
        core::string<wchar_t>::subString
                  (&local_50,(string<wchar_t> *)puVar1,uVar19,*(int *)&this->field_0xb0 - uVar19,
                   false);
        ::std::__cxx11::wstring::append((wstring *)&s_1);
        ::std::__cxx11::wstring::_M_dispose();
        core::string<wchar_t>::operator=((string<wchar_t> *)puVar1,(string<wchar_t> *)&s_1);
        this->CursorPos = uVar9;
        ::std::__cxx11::wstring::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        goto LAB_0022987d;
      }
    }
    else if (iVar8 == 0x43) {
      if ((this->PasswordBox == false) && (begin != end && this->Operator != (IOSOperator *)0x0)) {
        uVar9 = end;
        if ((int)begin < (int)end) {
          uVar9 = begin;
        }
        s.str._M_dataplus._M_p = (pointer)&s.str.field_2;
        s.str._M_string_length = 0;
        s.str.field_2._M_local_buf[0] = (uint)(uint3)s.str.field_2._M_allocated_capacity._1_3_ << 8;
        lVar16 = (long)(int)begin - (long)(int)end;
        lVar13 = -lVar16;
        if (0 < lVar16) {
          lVar13 = lVar16;
        }
        core::string<wchar_t>::subString
                  (&s_1,(string<wchar_t> *)&this->field_0xa8,uVar9,(s32)lVar13,false);
        core::wStringToUTF8((stringc *)&s,s_1.str._M_dataplus._M_p);
        ::std::__cxx11::wstring::_M_dispose();
        (*this->Operator->_vptr_IOSOperator[1])(this->Operator,s.str._M_dataplus._M_p);
LAB_002296bb:
        ::std::__cxx11::string::_M_dispose();
      }
    }
    else {
      if (iVar8 != 0x56) {
        if (iVar8 != 0x41) {
          return false;
        }
        end = *(uint *)&this->field_0xb0;
        goto LAB_0022950e;
      }
      cVar6 = (**(code **)(*(long *)this + 0x90))(this);
      if ((cVar6 != '\0') && (this->Operator != (IOSOperator *)0x0)) {
        uVar9 = this->MarkBegin;
        uVar4 = this->MarkEnd;
        uVar15 = uVar4;
        if ((int)uVar9 < (int)uVar4) {
          uVar15 = uVar9;
        }
        if ((int)uVar4 < (int)uVar9) {
          uVar4 = uVar9;
        }
        iVar8 = (*this->Operator->_vptr_IOSOperator[3])();
        if ((char *)CONCAT44(extraout_var,iVar8) != (char *)0x0) {
          s.str._M_dataplus._M_p = (pointer)&s.str.field_2;
          s.str._M_string_length = 0;
          s.str.field_2._M_local_buf[0] = L'\0';
          core::utf8ToWString(&s,(char *)CONCAT44(extraout_var,iVar8));
          puVar1 = &this->field_0xa8;
          if (this->MarkBegin == this->MarkEnd) {
            core::string<wchar_t>::subString
                      ((string<wchar_t> *)&s_1,(string<wchar_t> *)puVar1,0,this->CursorPos,false);
            ::std::__cxx11::wstring::append((wstring *)&s_1);
            core::string<wchar_t>::subString
                      (&local_50,(string<wchar_t> *)puVar1,this->CursorPos,
                       *(int *)&this->field_0xb0 - this->CursorPos,false);
            ::std::__cxx11::wstring::append((wstring *)&s_1);
            ::std::__cxx11::wstring::_M_dispose();
            if ((this->Max == 0) || ((uint)s_1.str._M_string_length <= this->Max)) {
              core::string<wchar_t>::operator=((string<wchar_t> *)puVar1,&s_1);
              core::string<wchar_t>::operator=(&s_1,&s);
              this->CursorPos = this->CursorPos + (uint)s_1.str._M_string_length;
            }
          }
          else {
            core::string<wchar_t>::subString
                      ((string<wchar_t> *)&s_1,(string<wchar_t> *)puVar1,0,uVar15,false);
            ::std::__cxx11::wstring::append((wstring *)&s_1);
            core::string<wchar_t>::subString
                      (&local_50,(string<wchar_t> *)puVar1,uVar4,*(int *)&this->field_0xb0 - uVar4,
                       false);
            ::std::__cxx11::wstring::append((wstring *)&s_1);
            ::std::__cxx11::wstring::_M_dispose();
            if ((this->Max == 0) || ((uint)s_1.str._M_string_length <= this->Max)) {
              core::string<wchar_t>::operator=((string<wchar_t> *)puVar1,&s_1);
              core::string<wchar_t>::operator=(&s_1,&s);
              this->CursorPos = uVar15 + (uint)s_1.str._M_string_length;
            }
          }
          ::std::__cxx11::wstring::_M_dispose();
          goto LAB_00229873;
        }
        goto LAB_0022987d;
      }
    }
    goto LAB_002296c0;
  }
  iVar8 = (event->field_1).MouseInput.Y;
  bVar7 = false;
  if (c != L'\0') {
    if (iVar8 - 0x70U < 0x18) {
      return false;
    }
    bVar7 = false;
    switch(iVar8) {
    case 8:
      cVar6 = (**(code **)(*(long *)this + 0x90))(this);
      if ((cVar6 != '\0') && (*(int *)&this->field_0xb0 != 0)) {
        s.str._M_dataplus._M_p = (pointer)&s.str.field_2;
        s.str._M_string_length = 0;
        s.str.field_2._M_local_buf[0] = L'\0';
        puVar1 = &this->field_0xa8;
        uVar9 = this->MarkBegin;
        uVar4 = this->MarkEnd;
        if (uVar9 == uVar4) {
          if (this->CursorPos < 1) {
            core::string<wchar_t>::operator=(&s,L"");
          }
          else {
            core::string<wchar_t>::subString
                      (&s_1,(string<wchar_t> *)puVar1,0,this->CursorPos + -1,false);
            core::string<wchar_t>::operator=(&s,&s_1);
            ::std::__cxx11::wstring::_M_dispose();
          }
          core::string<wchar_t>::subString
                    (&s_1,(string<wchar_t> *)puVar1,this->CursorPos,
                     *(int *)&this->field_0xb0 - this->CursorPos,false);
          ::std::__cxx11::wstring::append((wstring *)&s);
          ::std::__cxx11::wstring::_M_dispose();
          core::string<wchar_t>::operator=((string<wchar_t> *)puVar1,(string<wchar_t> *)&s);
          uVar15 = this->CursorPos - 1;
        }
        else {
          uVar15 = uVar4;
          if ((int)uVar9 < (int)uVar4) {
            uVar15 = uVar9;
          }
          if ((int)uVar4 < (int)uVar9) {
            uVar4 = uVar9;
          }
          core::string<wchar_t>::subString(&s_1,(string<wchar_t> *)puVar1,0,uVar15,false);
          core::string<wchar_t>::operator=((string<wchar_t> *)&s,&s_1);
          ::std::__cxx11::wstring::_M_dispose();
          core::string<wchar_t>::subString
                    (&s_1,(string<wchar_t> *)puVar1,uVar4,*(int *)&this->field_0xb0 - uVar4,false);
          ::std::__cxx11::wstring::append((wstring *)&s);
          ::std::__cxx11::wstring::_M_dispose();
          core::string<wchar_t>::operator=((string<wchar_t> *)puVar1,(string<wchar_t> *)&s);
        }
        this->CursorPos = uVar15;
        if ((int)uVar15 < 0) {
          this->CursorPos = 0;
        }
        uVar9 = os::Timer::getTime();
        this->BlinkStartTime = uVar9;
LAB_00229873:
        ::std::__cxx11::wstring::_M_dispose();
        goto LAB_0022987d;
      }
      goto LAB_002296c0;
    case 9:
    case 0x10:
      goto switchD_00228eae_caseD_9;
    case 10:
    case 0xb:
    case 0xc:
    case 0xe:
    case 0xf:
      break;
    case 0xd:
      if (this->MultiLine != true) {
        calculateScrollPos(this);
        type = EGET_EDITBOX_ENTER;
        goto LAB_0022989b;
      }
      c = L'\n';
      break;
    default:
      if (iVar8 == 0x1b) {
        return false;
      }
      if ((iVar8 == 0x2e) && (c == L'\x7f')) goto switchD_00228fb2_caseD_2e;
    }
switchD_00228eae_caseD_a:
    inputChar(this,c);
    goto LAB_002296d5;
  }
  uVar19 = end;
  switch(iVar8) {
  case 0x23:
    if ((this->WordWrap == false) && (this->MultiLine == false)) {
      uVar10 = *(uint *)&this->field_0xb0;
      uVar19 = this->CursorPos;
    }
    else {
      uVar19 = this->CursorPos;
      uVar12 = getLineFromPos(this,uVar19);
      iVar8 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar12];
      psVar2 = &(this->BrokenText).m_data.
                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar12].str._M_string_length;
      uVar12 = iVar8 + (int)*psVar2;
      if (uVar12 != 0 && SCARRY4(iVar8,(int)*psVar2) == (int)uVar12 < 0) {
        uVar10 = uVar12 - 1;
        iVar8 = *(int *)(*(long *)&this->field_0xa8 + (ulong)uVar10 * 4);
        if ((iVar8 == 0xd) || (iVar8 == 10)) goto LAB_0022968a;
      }
      uVar10 = uVar12;
    }
LAB_0022968a:
    if (begin != end) {
      uVar19 = begin;
    }
    end = uVar10;
    if ((bVar3 & 2) == 0) {
      end = 0;
      uVar19 = 0;
    }
    this->CursorPos = uVar10;
    goto LAB_002296a6;
  case 0x24:
    if ((this->WordWrap == false) && (this->MultiLine == false)) {
      uVar19 = this->CursorPos;
      uVar12 = 0;
    }
    else {
      uVar19 = this->CursorPos;
      uVar12 = getLineFromPos(this,uVar19);
      uVar12 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar12];
    }
    if (begin != end) {
      uVar19 = begin;
    }
    end = uVar12;
    if ((bVar3 & 2) == 0) {
      end = 0;
      uVar19 = 0;
    }
    this->CursorPos = uVar12;
LAB_002296a6:
    uVar9 = os::Timer::getTime();
    this->BlinkStartTime = uVar9;
    begin = uVar19;
    break;
  case 0x25:
    uVar19 = this->CursorPos;
    if ((bVar3 & 2) == 0) {
      begin = 0;
      end = 0;
      uVar12 = 0;
      if (0 < (int)uVar19) {
LAB_002295ea:
        end = uVar12;
        this->CursorPos = uVar19 - 1;
      }
    }
    else if (0 < (int)uVar19) {
      if (begin == end) {
        begin = uVar19;
      }
      uVar12 = uVar19 - 1;
      goto LAB_002295ea;
    }
    goto LAB_00229616;
  case 0x26:
    if (this->MultiLine == false) {
      if (this->WordWrap != true) {
        return false;
      }
      if (((long)(this->BrokenText).m_data.
                 super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->BrokenText).m_data.
                 super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0x1fffffffc0U) == 0) {
        return false;
      }
    }
    uVar12 = this->CursorPos;
    uVar10 = getLineFromPos(this,uVar12);
    if (begin != end && (int)end <= (int)begin) {
      uVar19 = begin;
    }
    if (begin == end) {
      uVar19 = uVar12;
    }
    if (0 < (int)uVar10) {
      piVar5 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar17 = uVar12 - piVar5[uVar10];
      iVar8 = (int)(this->BrokenText).m_data.
                   super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10 - 1].str._M_string_length;
      iVar11 = piVar5[uVar10 - 1];
LAB_002295c4:
      if (iVar8 < iVar17) {
        uVar12 = (iVar11 + iVar8 + (uint)(iVar8 == 0)) - 1;
      }
      else {
        uVar12 = iVar17 + iVar11;
      }
      this->CursorPos = uVar12;
    }
    goto LAB_00229630;
  case 0x27:
    uVar19 = (uint)*(undefined8 *)&this->field_0xb0;
    if ((bVar3 & 2) == 0) {
      uVar12 = this->CursorPos;
      end = 0;
      begin = 0;
    }
    else {
      uVar12 = this->CursorPos;
      if (uVar12 < uVar19) {
        if (begin == end) {
          begin = uVar12;
        }
        end = uVar12 + 1;
      }
    }
    if (uVar12 < uVar19) {
      this->CursorPos = uVar12 + 1;
    }
LAB_00229616:
    uVar9 = os::Timer::getTime();
    this->BlinkStartTime = uVar9;
    break;
  case 0x28:
    if (this->MultiLine == true) {
      psVar14 = (this->BrokenText).m_data.
                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (long)(this->BrokenText).m_data.
                     super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar14;
    }
    else {
      if (this->WordWrap != true) {
        return false;
      }
      psVar14 = (this->BrokenText).m_data.
                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (long)(this->BrokenText).m_data.
                     super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar14;
      if ((uVar18 & 0x1fffffffc0) == 0) {
        return false;
      }
    }
    uVar12 = this->CursorPos;
    uVar10 = getLineFromPos(this,uVar12);
    if ((int)begin < (int)end) {
      uVar19 = begin;
    }
    if (begin == end) {
      uVar19 = uVar12;
    }
    if ((int)uVar10 < (int)(uVar18 >> 5) + -1) {
      piVar5 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar17 = uVar12 - piVar5[uVar10];
      iVar8 = (int)psVar14[uVar10 + 1].str._M_string_length;
      iVar11 = piVar5[uVar10 + 1];
      goto LAB_002295c4;
    }
LAB_00229630:
    begin = uVar19;
    end = uVar12;
    if (((event->field_1).field13[0xc] & 2) == 0) {
      begin = 0;
      end = 0;
    }
    break;
  default:
    goto switchD_00228eae_caseD_9;
  case 0x2d:
    cVar6 = (**(code **)(*(long *)this + 0x90))(this);
    if (cVar6 != '\0') {
      this->OverwriteMode = (bool)(this->OverwriteMode ^ 1);
    }
    break;
  case 0x2e:
switchD_00228fb2_caseD_2e:
    cVar6 = (**(code **)(*(long *)this + 0x90))(this);
    if ((cVar6 != '\0') && (bVar7 = keyDelete(this), bVar7)) {
      uVar9 = os::Timer::getTime();
      this->BlinkStartTime = uVar9;
LAB_0022987d:
      setTextMarkers(this,0,0);
      breakText(this);
      calculateScrollPos(this);
      type = EGET_EDITBOX_CHANGED;
LAB_0022989b:
      sendGuiEvent(this,type);
      goto LAB_002296d5;
    }
  }
LAB_002296c0:
  setTextMarkers(this,begin,end);
  calculateScrollPos(this);
LAB_002296d5:
  bVar7 = true;
switchD_00228eae_caseD_9:
  return bVar7;
}

Assistant:

bool CGUIEditBox::processKey(const SEvent &event)
{
	if (!event.KeyInput.PressedDown)
		return false;

	bool textChanged = false;
	s32 newMarkBegin = MarkBegin;
	s32 newMarkEnd = MarkEnd;

	// control shortcut handling

	if (event.KeyInput.Control) {
		// german backlash '\' entered with control + '?'
		if (event.KeyInput.Char == '\\') {
			inputChar(event.KeyInput.Char);
			return true;
		}

		switch (event.KeyInput.Key) {
		case KEY_KEY_A:
			// select all
			newMarkBegin = 0;
			newMarkEnd = Text.size();
			break;
		case KEY_KEY_C:
			// copy to clipboard
			if (!PasswordBox && Operator && MarkBegin != MarkEnd) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				core::stringc s;
				wStringToUTF8(s, Text.subString(realmbgn, realmend - realmbgn));
				Operator->copyToClipboard(s.c_str());
			}
			break;
		case KEY_KEY_X:
			// cut to the clipboard
			if (!PasswordBox && Operator && MarkBegin != MarkEnd) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				// copy
				core::stringc sc;
				wStringToUTF8(sc, Text.subString(realmbgn, realmend - realmbgn));
				Operator->copyToClipboard(sc.c_str());

				if (isEnabled()) {
					// delete
					core::stringw s;
					s = Text.subString(0, realmbgn);
					s.append(Text.subString(realmend, Text.size() - realmend));
					Text = s;

					CursorPos = realmbgn;
					newMarkBegin = 0;
					newMarkEnd = 0;
					textChanged = true;
				}
			}
			break;
		case KEY_KEY_V:
			if (!isEnabled())
				break;

			// paste from the clipboard
			if (Operator) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				// add the string
				const c8 *p = Operator->getTextFromClipboard();
				if (p) {
					irr::core::stringw widep;
					core::utf8ToWString(widep, p);

					if (MarkBegin == MarkEnd) {
						// insert text
						core::stringw s = Text.subString(0, CursorPos);
						s.append(widep);
						s.append(Text.subString(CursorPos, Text.size() - CursorPos));

						if (!Max || s.size() <= Max) { // thx to Fish FH for fix
							Text = s;
							s = widep;
							CursorPos += s.size();
						}
					} else {
						// replace text

						core::stringw s = Text.subString(0, realmbgn);
						s.append(widep);
						s.append(Text.subString(realmend, Text.size() - realmend));

						if (!Max || s.size() <= Max) { // thx to Fish FH for fix
							Text = s;
							s = widep;
							CursorPos = realmbgn + s.size();
						}
					}
				}

				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;
		case KEY_HOME:
			// move/highlight to start of text
			if (event.KeyInput.Shift) {
				newMarkEnd = CursorPos;
				newMarkBegin = 0;
				CursorPos = 0;
			} else {
				CursorPos = 0;
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			break;
		case KEY_END:
			// move/highlight to end of text
			if (event.KeyInput.Shift) {
				newMarkBegin = CursorPos;
				newMarkEnd = Text.size();
				CursorPos = 0;
			} else {
				CursorPos = Text.size();
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			break;
		default:
			return false;
		}
	}
	// Some special keys - but only handle them if KeyInput.Char is null as on some systems (X11) they might have same key-code as ansi-keys otherwise
	else if (event.KeyInput.Char == 0) {
		switch (event.KeyInput.Key) {
		case KEY_END: {
			s32 p = Text.size();
			if (WordWrap || MultiLine) {
				p = getLineFromPos(CursorPos);
				p = BrokenTextPositions[p] + (s32)BrokenText[p].size();
				if (p > 0 && (Text[p - 1] == L'\r' || Text[p - 1] == L'\n'))
					p -= 1;
			}

			if (event.KeyInput.Shift) {
				if (MarkBegin == MarkEnd)
					newMarkBegin = CursorPos;

				newMarkEnd = p;
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			CursorPos = p;
			BlinkStartTime = os::Timer::getTime();
		} break;
		case KEY_HOME: {

			s32 p = 0;
			if (WordWrap || MultiLine) {
				p = getLineFromPos(CursorPos);
				p = BrokenTextPositions[p];
			}

			if (event.KeyInput.Shift) {
				if (MarkBegin == MarkEnd)
					newMarkBegin = CursorPos;
				newMarkEnd = p;
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			CursorPos = p;
			BlinkStartTime = os::Timer::getTime();
		} break;
		case KEY_LEFT:

			if (event.KeyInput.Shift) {
				if (CursorPos > 0) {
					if (MarkBegin == MarkEnd)
						newMarkBegin = CursorPos;

					newMarkEnd = CursorPos - 1;
				}
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}

			if (CursorPos > 0)
				CursorPos--;
			BlinkStartTime = os::Timer::getTime();
			break;

		case KEY_RIGHT:
			if (event.KeyInput.Shift) {
				if (Text.size() > (u32)CursorPos) {
					if (MarkBegin == MarkEnd)
						newMarkBegin = CursorPos;

					newMarkEnd = CursorPos + 1;
				}
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}

			if (Text.size() > (u32)CursorPos)
				CursorPos++;
			BlinkStartTime = os::Timer::getTime();
			break;
		case KEY_UP:
			if (MultiLine || (WordWrap && BrokenText.size() > 1)) {
				s32 lineNo = getLineFromPos(CursorPos);
				s32 mb = (MarkBegin == MarkEnd) ? CursorPos : (MarkBegin > MarkEnd ? MarkBegin : MarkEnd);
				if (lineNo > 0) {
					s32 cp = CursorPos - BrokenTextPositions[lineNo];
					if ((s32)BrokenText[lineNo - 1].size() < cp)
						CursorPos = BrokenTextPositions[lineNo - 1] + core::max_((u32)1, BrokenText[lineNo - 1].size()) - 1;
					else
						CursorPos = BrokenTextPositions[lineNo - 1] + cp;
				}

				if (event.KeyInput.Shift) {
					newMarkBegin = mb;
					newMarkEnd = CursorPos;
				} else {
					newMarkBegin = 0;
					newMarkEnd = 0;
				}

			} else {
				return false;
			}
			break;
		case KEY_DOWN:
			if (MultiLine || (WordWrap && BrokenText.size() > 1)) {
				s32 lineNo = getLineFromPos(CursorPos);
				s32 mb = (MarkBegin == MarkEnd) ? CursorPos : (MarkBegin < MarkEnd ? MarkBegin : MarkEnd);
				if (lineNo < (s32)BrokenText.size() - 1) {
					s32 cp = CursorPos - BrokenTextPositions[lineNo];
					if ((s32)BrokenText[lineNo + 1].size() < cp)
						CursorPos = BrokenTextPositions[lineNo + 1] + core::max_((u32)1, BrokenText[lineNo + 1].size()) - 1;
					else
						CursorPos = BrokenTextPositions[lineNo + 1] + cp;
				}

				if (event.KeyInput.Shift) {
					newMarkBegin = mb;
					newMarkEnd = CursorPos;
				} else {
					newMarkBegin = 0;
					newMarkEnd = 0;
				}

			} else {
				return false;
			}
			break;
		case KEY_INSERT:
			if (!isEnabled())
				break;

			OverwriteMode = !OverwriteMode;
			break;
		case KEY_DELETE:
			if (!isEnabled())
				break;

			if (keyDelete()) {
				BlinkStartTime = os::Timer::getTime();
				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;
		default:
			return false;
		}
	} else {
		// default keyboard handling
		switch (event.KeyInput.Key) {
		case KEY_RETURN:
			if (MultiLine) {
				inputChar(L'\n');
			} else {
				calculateScrollPos();
				sendGuiEvent(EGET_EDITBOX_ENTER);
			}
			return true;

		case KEY_BACK:
			if (!isEnabled())
				break;

			if (Text.size()) {
				core::stringw s;

				if (MarkBegin != MarkEnd) {
					// delete marked text
					const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
					const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

					s = Text.subString(0, realmbgn);
					s.append(Text.subString(realmend, Text.size() - realmend));
					Text = s;

					CursorPos = realmbgn;
				} else {
					// delete text behind cursor
					if (CursorPos > 0)
						s = Text.subString(0, CursorPos - 1);
					else
						s = L"";
					s.append(Text.subString(CursorPos, Text.size() - CursorPos));
					Text = s;
					--CursorPos;
				}

				if (CursorPos < 0)
					CursorPos = 0;
				BlinkStartTime = os::Timer::getTime();
				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;

		case KEY_DELETE:

			// At least on X11 we get a char with 127 when the delete key is pressed.
			// We get no char when the delete key on numkeys is pressed with numlock off (handled in the other case calling keyDelete as Char is then 0).
			// We get a keykode != 127 when delete key on numlock is pressed with numlock on.
			if (event.KeyInput.Char == 127) {
				if (!isEnabled())
					break;

				if (keyDelete()) {
					BlinkStartTime = os::Timer::getTime();
					newMarkBegin = 0;
					newMarkEnd = 0;
					textChanged = true;
				}
				break;
			} else {
				inputChar(event.KeyInput.Char);
				return true;
			}

		case KEY_ESCAPE:
		case KEY_TAB:
		case KEY_SHIFT:
		case KEY_F1:
		case KEY_F2:
		case KEY_F3:
		case KEY_F4:
		case KEY_F5:
		case KEY_F6:
		case KEY_F7:
		case KEY_F8:
		case KEY_F9:
		case KEY_F10:
		case KEY_F11:
		case KEY_F12:
		case KEY_F13:
		case KEY_F14:
		case KEY_F15:
		case KEY_F16:
		case KEY_F17:
		case KEY_F18:
		case KEY_F19:
		case KEY_F20:
		case KEY_F21:
		case KEY_F22:
		case KEY_F23:
		case KEY_F24:
			// ignore these keys
			return false;

		default:
			inputChar(event.KeyInput.Char);
			return true;
		}
	}

	// Set new text markers
	setTextMarkers(newMarkBegin, newMarkEnd);

	// break the text if it has changed
	if (textChanged) {
		breakText();
		calculateScrollPos();
		sendGuiEvent(EGET_EDITBOX_CHANGED);
	} else {
		calculateScrollPos();
	}

	return true;
}